

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_esni_init_context
              (ptls_context_t *ctx,ptls_esni_context_t *esni,ptls_iovec_t esni_keys,
              ptls_key_exchange_context_t **key_exchanges)

{
  ptls_key_exchange_context_t *ppVar1;
  uint8_t *puVar2;
  long local_108;
  size_t i_1;
  uint8_t *end_5;
  size_t _block_size_4;
  size_t _capacity_4;
  uint8_t *puStack_e0;
  uint16_t ext_type;
  uint8_t *end_4;
  size_t _block_size_3;
  size_t _capacity_3;
  size_t i;
  ptls_key_exchange_context_t *ppStack_b8;
  uint16_t id_1;
  void *newp;
  uint8_t *end_3;
  size_t _block_size_2;
  size_t _capacity_2;
  ptls_key_exchange_context_t **found;
  uint8_t *end_2;
  size_t _block_size_1;
  size_t _capacity_1;
  ptls_key_exchange_context_t **pppStack_70;
  uint16_t id;
  uint8_t *end_1;
  size_t _block_size;
  size_t _capacity;
  long lStack_50;
  int ret;
  size_t num_cipher_suites;
  size_t num_key_exchanges;
  uint8_t *end;
  uint8_t *src;
  ptls_key_exchange_context_t **key_exchanges_local;
  ptls_esni_context_t *esni_local;
  ptls_context_t *ctx_local;
  ptls_iovec_t esni_keys_local;
  
  esni_keys_local.base = (uint8_t *)esni_keys.len;
  end = esni_keys.base;
  num_key_exchanges = (size_t)(esni_keys_local.base + (long)&((ptls_context_t *)end)->random_bytes);
  lStack_50 = 0;
  for (num_cipher_suites = 0; key_exchanges[num_cipher_suites] != (ptls_key_exchange_context_t *)0x0
      ; num_cipher_suites = num_cipher_suites + 1) {
  }
  src = (uint8_t *)key_exchanges;
  key_exchanges_local = (ptls_key_exchange_context_t **)esni;
  esni_local = (ptls_esni_context_t *)ctx;
  ctx_local = (ptls_context_t *)end;
  memset(esni,0,0x28);
  ppVar1 = (ptls_key_exchange_context_t *)malloc((num_cipher_suites + 1) * 8);
  *key_exchanges_local = ppVar1;
  if (ppVar1 == (ptls_key_exchange_context_t *)0x0) {
    _capacity._4_4_ = 0x201;
  }
  else {
    memcpy(*key_exchanges_local,src,(num_cipher_suites + 1) * 8);
    if ((long)(num_key_exchanges - (long)end) < 6) {
      _capacity._4_4_ = 0x33;
    }
    else {
      end = end + 6;
      _block_size = 2;
      if (num_key_exchanges - (long)end < 2) {
        _capacity._4_4_ = 0x32;
      }
      else {
        end_1 = (uint8_t *)0x0;
        do {
          puVar2 = end + 1;
          end_1 = (uint8_t *)((long)end_1 << 8 | (ulong)*end);
          _block_size = _block_size - 1;
          end = puVar2;
        } while (_block_size != 0);
        _block_size = 0;
        if ((uint8_t *)(num_key_exchanges - (long)puVar2) < end_1) {
          _capacity._4_4_ = 0x32;
        }
        else {
          pppStack_70 = (ptls_key_exchange_context_t **)(puVar2 + (long)end_1);
          do {
            _capacity._4_4_ =
                 ptls_decode16((uint16_t *)((long)&_capacity_1 + 6),&end,(uint8_t *)pppStack_70);
            if (_capacity._4_4_ != 0) goto LAB_00120726;
            _block_size_1 = 2;
            if ((ulong)((long)pppStack_70 - (long)end) < 2) {
              _capacity._4_4_ = 0x32;
              goto LAB_00120726;
            }
            end_2 = (uint8_t *)0x0;
            do {
              puVar2 = end + 1;
              end_2 = (uint8_t *)((long)end_2 << 8 | (ulong)*end);
              _block_size_1 = _block_size_1 - 1;
              end = puVar2;
            } while (_block_size_1 != 0);
            _block_size_1 = 0;
            if ((uint8_t *)((long)pppStack_70 - (long)puVar2) < end_2) {
              _capacity._4_4_ = 0x32;
              goto LAB_00120726;
            }
            found = (ptls_key_exchange_context_t **)(puVar2 + (long)end_2);
            for (_capacity_2 = (size_t)src;
                (*(long *)_capacity_2 != 0 &&
                (*(short *)**(undefined8 **)_capacity_2 != _capacity_1._6_2_));
                _capacity_2 = _capacity_2 + 8) {
            }
            if (_capacity_2 == 0) {
              _capacity._4_4_ = 0x204;
              end = (uint8_t *)found;
              goto LAB_00120726;
            }
            _capacity._4_4_ = 0;
            end = (uint8_t *)found;
          } while (found != pppStack_70);
          if (found == pppStack_70) {
            _block_size_2 = 2;
            if (num_key_exchanges - (long)found < 2) {
              _capacity._4_4_ = 0x32;
              end = (uint8_t *)found;
            }
            else {
              end_3 = (uint8_t *)0x0;
              end = (uint8_t *)found;
              do {
                puVar2 = end + 1;
                end_3 = (uint8_t *)((long)end_3 << 8 | (ulong)*end);
                _block_size_2 = _block_size_2 - 1;
                end = puVar2;
              } while (_block_size_2 != 0);
              _block_size_2 = 0;
              if ((uint8_t *)(num_key_exchanges - (long)puVar2) < end_3) {
                _capacity._4_4_ = 0x32;
              }
              else {
                newp = puVar2 + (long)end_3;
                _capacity._4_4_ = 0;
                do {
                  _capacity._4_4_ = ptls_decode16((uint16_t *)((long)&i + 6),&end,(uint8_t *)newp);
                  if (_capacity._4_4_ != 0) goto LAB_00120726;
                  _capacity_3 = 0;
                  while ((*(long *)(esni_local->not_before + _capacity_3 * 8) != 0 &&
                         (**(short **)(esni_local->not_before + _capacity_3 * 8) != i._6_2_))) {
                    _capacity_3 = _capacity_3 + 1;
                  }
                  if (*(long *)(esni_local->not_before + _capacity_3 * 8) != 0) {
                    ppStack_b8 = (ptls_key_exchange_context_t *)
                                 realloc(key_exchanges_local[1],(lStack_50 + 1) * 0x48);
                    if (ppStack_b8 == (ptls_key_exchange_context_t *)0x0) {
                      _capacity._4_4_ = 0x201;
                      goto LAB_00120726;
                    }
                    key_exchanges_local[1] = ppStack_b8;
                    *(undefined8 *)((long)key_exchanges_local[1] + lStack_50 * 0x48) =
                         *(undefined8 *)(esni_local->not_before + _capacity_3 * 8);
                    lStack_50 = lStack_50 + 1;
                  }
                } while (end != (uint8_t *)newp);
                ppStack_b8 = (ptls_key_exchange_context_t *)
                             realloc(key_exchanges_local[1],(lStack_50 + 1) * 0x48);
                if (ppStack_b8 == (ptls_key_exchange_context_t *)0x0) {
                  _capacity._4_4_ = 0x201;
                }
                else {
                  key_exchanges_local[1] = ppStack_b8;
                  *(undefined8 *)((long)key_exchanges_local[1] + lStack_50 * 0x48) = 0;
                  if (end == (uint8_t *)newp) {
                    _capacity._4_4_ =
                         ptls_decode16((uint16_t *)(key_exchanges_local + 2),&end,
                                       (uint8_t *)num_key_exchanges);
                    if (((_capacity._4_4_ == 0) &&
                        (_capacity._4_4_ =
                              ptls_decode64((uint64_t *)(key_exchanges_local + 3),&end,
                                            (uint8_t *)num_key_exchanges), _capacity._4_4_ == 0)) &&
                       (_capacity._4_4_ =
                             ptls_decode64((uint64_t *)(key_exchanges_local + 4),&end,
                                           (uint8_t *)num_key_exchanges), _capacity._4_4_ == 0)) {
                      _block_size_3 = 2;
                      if (num_key_exchanges - (long)end < 2) {
                        _capacity._4_4_ = 0x32;
                      }
                      else {
                        end_4 = (uint8_t *)0x0;
                        do {
                          puVar2 = end + 1;
                          end_4 = (uint8_t *)((long)end_4 << 8 | (ulong)*end);
                          _block_size_3 = _block_size_3 - 1;
                          end = puVar2;
                        } while (_block_size_3 != 0);
                        _block_size_3 = 0;
                        if ((uint8_t *)(num_key_exchanges - (long)puVar2) < end_4) {
                          _capacity._4_4_ = 0x32;
                        }
                        else {
                          puStack_e0 = puVar2 + (long)end_4;
                          while (_capacity._4_4_ = 0, end != puStack_e0) {
                            _capacity._4_4_ =
                                 ptls_decode16((uint16_t *)((long)&_capacity_4 + 6),&end,puStack_e0)
                            ;
                            if (_capacity._4_4_ != 0) goto LAB_00120726;
                            _block_size_4 = 2;
                            if ((ulong)((long)puStack_e0 - (long)end) < 2) {
                              _capacity._4_4_ = 0x32;
                              goto LAB_00120726;
                            }
                            end_5 = (uint8_t *)0x0;
                            do {
                              puVar2 = end + 1;
                              end_5 = (uint8_t *)((long)end_5 << 8 | (ulong)*end);
                              _block_size_4 = _block_size_4 - 1;
                              end = puVar2;
                            } while (_block_size_4 != 0);
                            if (puStack_e0 + -(long)puVar2 < end_5) {
                              _capacity._4_4_ = 0x32;
                              goto LAB_00120726;
                            }
                            end = puVar2 + (long)end_5;
                          }
                          if (end == puStack_e0) {
                            if (end == (uint8_t *)num_key_exchanges) {
                              for (local_108 = 0; _capacity._4_4_ = 0,
                                  *(long *)((long)key_exchanges_local[1] + local_108 * 0x48) != 0;
                                  local_108 = local_108 + 1) {
                                _capacity._4_4_ =
                                     ptls_calc_hash(*(ptls_hash_algorithm_t **)
                                                     (*(long *)((long)key_exchanges_local[1] +
                                                               local_108 * 0x48) + 0x10),
                                                    (void *)((long)key_exchanges_local[1] +
                                                            local_108 * 0x48 + 8),ctx_local,
                                                    (size_t)esni_keys_local.base);
                                if (_capacity._4_4_ != 0) goto LAB_00120726;
                              }
                              _capacity._4_4_ = 0;
                            }
                            else {
                              _capacity._4_4_ = 0x32;
                            }
                          }
                          else {
                            _capacity._4_4_ = 0x32;
                          }
                        }
                      }
                    }
                  }
                  else {
                    _capacity._4_4_ = 0x32;
                  }
                }
              }
            }
          }
          else {
            _capacity._4_4_ = 0x32;
            end = (uint8_t *)found;
          }
        }
      }
    }
  }
LAB_00120726:
  if (_capacity._4_4_ != 0) {
    ptls_esni_dispose_context((ptls_esni_context_t *)key_exchanges_local);
  }
  return _capacity._4_4_;
}

Assistant:

int ptls_esni_init_context(ptls_context_t *ctx, ptls_esni_context_t *esni, ptls_iovec_t esni_keys,
                           ptls_key_exchange_context_t **key_exchanges)
{
    const uint8_t *src = esni_keys.base, *const end = src + esni_keys.len;
    size_t num_key_exchanges, num_cipher_suites = 0;
    int ret;

    for (num_key_exchanges = 0; key_exchanges[num_key_exchanges] != NULL; ++num_key_exchanges)
        ;

    memset(esni, 0, sizeof(*esni));
    if ((esni->key_exchanges = malloc(sizeof(*esni->key_exchanges) * (num_key_exchanges + 1))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    memcpy(esni->key_exchanges, key_exchanges, sizeof(*esni->key_exchanges) * (num_key_exchanges + 1));

    /* ESNIKeys */
    if (end - src < 6) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    src += 6;
    ptls_decode_open_block(src, end, 2, {
        do {
            /* parse */
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
            /* check that matching key-share exists */
            ptls_key_exchange_context_t **found;
            for (found = key_exchanges; *found != NULL; ++found)
                if ((*found)->algo->id == id)
                    break;
            if (found == NULL) {
                ret = PTLS_ERROR_INCOMPATIBLE_KEY;
                goto Exit;
            }
        } while (src != end);
    });
    ptls_decode_open_block(src, end, 2, {
        void *newp;
        do {
            uint16_t id;
            if ((ret = ptls_decode16(&id, &src, end)) != 0)
                goto Exit;
            size_t i;
            for (i = 0; ctx->cipher_suites[i] != NULL; ++i)
                if (ctx->cipher_suites[i]->id == id)
                    break;
            if (ctx->cipher_suites[i] != NULL) {
                if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
                    ret = PTLS_ERROR_NO_MEMORY;
                    goto Exit;
                }
                esni->cipher_suites = newp;
                esni->cipher_suites[num_cipher_suites++].cipher_suite = ctx->cipher_suites[i];
            }
        } while (src != end);
        if ((newp = realloc(esni->cipher_suites, sizeof(*esni->cipher_suites) * (num_cipher_suites + 1))) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        esni->cipher_suites = newp;
        esni->cipher_suites[num_cipher_suites].cipher_suite = NULL;
    });
    if ((ret = ptls_decode16(&esni->padded_length, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_before, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode64(&esni->not_after, &src, end)) != 0)
        goto Exit;
    ptls_decode_block(src, end, 2, {
        while (src != end) {
            uint16_t ext_type;
            if ((ret = ptls_decode16(&ext_type, &src, end)) != 0)
                goto Exit;
            ptls_decode_open_block(src, end, 2, { src = end; });
        }
    });

    { /* calculate digests for every cipher-suite */
        size_t i;
        for (i = 0; esni->cipher_suites[i].cipher_suite != NULL; ++i) {
            if ((ret = ptls_calc_hash(esni->cipher_suites[i].cipher_suite->hash, esni->cipher_suites[i].record_digest,
                                      esni_keys.base, esni_keys.len)) != 0)
                goto Exit;
        }
    }

    ret = 0;
Exit:
    if (ret != 0)
        ptls_esni_dispose_context(esni);
    return ret;
}